

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O0

double __thiscall HyperGraph::self_inf_cal(HyperGraph *this,Nodelist *vecSeed)

{
  size_t sVar1;
  uint uVar2;
  size_type __n;
  _Bit_pointer puVar3;
  bool bVar4;
  reference puVar5;
  reference this_00;
  reference puVar6;
  difference_type dVar7;
  undefined1 auVar8 [16];
  reference rVar9;
  iterator iVar10;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_149;
  _Bit_type *local_148;
  uint local_140;
  _Bit_type *local_138;
  uint local_130;
  _Bit_type *local_128;
  uint local_120;
  _Bit_type *local_118;
  uint local_110;
  reference local_108;
  size_type local_f8;
  unsigned_long node;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  const_iterator cStack_d0;
  uint seed_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  Nodelist *__range1_1;
  _Bit_type local_b0;
  uint local_a4;
  const_iterator cStack_a0;
  uint seed;
  const_iterator __end1;
  const_iterator __begin1;
  Nodelist *__range1;
  undefined1 local_80 [8];
  vector<bool,_std::allocator<bool>_> vecBoolSeed;
  allocator<bool> local_41;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> vecBoolVst;
  Nodelist *vecSeed_local;
  HyperGraph *this_local;
  
  __n = this->__numRRsets;
  vecBoolVst.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)vecSeed;
  std::allocator<bool>::allocator(&local_41);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_40,__n,&local_41);
  std::allocator<bool>::~allocator(&local_41);
  uVar2 = this->__numV;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&__range1 + 7));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_80,(ulong)uVar2,
             (allocator<bool> *)((long)&__range1 + 7));
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&__range1 + 7));
  puVar3 = vecBoolVst.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      vecBoolVst.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
  cStack_a0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)puVar3);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff60);
    puVar3 = vecBoolVst.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
    if (!bVar4) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    local_a4 = *puVar5;
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_80,(ulong)local_a4);
    local_b0 = rVar9._M_mask;
    __range1_1 = (Nodelist *)rVar9._M_p;
    std::_Bit_reference::operator=((_Bit_reference *)&__range1_1,true);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        vecBoolVst.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
  cStack_d0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)puVar3);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff30);
    if (!bVar4) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1_1);
    this_00 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[](&this->_FRsets,(ulong)*puVar5);
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
    node = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&node);
      if (!bVar4) break;
      puVar6 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      local_f8 = *puVar6;
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_40,local_f8);
      local_108 = rVar9;
      std::_Bit_reference::operator=(&local_108,true);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1_1);
  }
  iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                     ((vector<bool,_std::allocator<bool>_> *)local_40);
  local_128 = iVar10.super__Bit_iterator_base._M_p;
  local_120 = iVar10.super__Bit_iterator_base._M_offset;
  local_118 = local_128;
  local_110 = local_120;
  iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                     ((vector<bool,_std::allocator<bool>_> *)local_40);
  local_148 = iVar10.super__Bit_iterator_base._M_p;
  local_140 = iVar10.super__Bit_iterator_base._M_offset;
  local_149 = true;
  __first.super__Bit_iterator_base._M_offset = local_110;
  __first.super__Bit_iterator_base._M_p = local_118;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar10.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar10.super__Bit_iterator_base._0_12_,8);
  local_138 = local_148;
  local_130 = local_140;
  dVar7 = std::count<std::_Bit_iterator,bool>(__first,__last,&local_149);
  uVar2 = this->__numV;
  sVar1 = this->__numRRsets;
  auVar8._8_4_ = (int)(sVar1 >> 0x20);
  auVar8._0_8_ = sVar1;
  auVar8._12_4_ = 0x45300000;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_80)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_40)
  ;
  return ((double)dVar7 * (double)uVar2) /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
}

Assistant:

double self_inf_cal(const Nodelist& vecSeed)
    {
        std::vector<bool> vecBoolVst = std::vector<bool>(__numRRsets);
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;
        for (auto seed : vecSeed)
        {
            for (auto node : _FRsets[seed])
            {
                vecBoolVst[node] = true;
            }
        }
        return 1.0 * std::count(vecBoolVst.begin(), vecBoolVst.end(), true) * __numV / __numRRsets;
    }